

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

Instruction ** __thiscall
Hpipe::Vec<Hpipe::Instruction*>::push_back<Hpipe::Instruction*&>
          (Vec<Hpipe::Instruction*> *this,Instruction **args)

{
  std::vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>>::
  emplace_back<Hpipe::Instruction*&>
            ((vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>> *)this,args);
  return (Instruction **)(*(long *)(this + 8) + -8);
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }